

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::LiteralExpr::~LiteralExpr(LiteralExpr *this)

{
  ~LiteralExpr(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

LiteralExpr(const Location & loc, const Value& v)
      : Expression(loc), value(v) {}